

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_brts.h
# Opt level: O0

void __thiscall BRTS<UFPC>::SecondScan(BRTS<UFPC> *this)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  uint *puVar5;
  uint local_3c;
  int j;
  int label;
  unsigned_short end_pos;
  unsigned_short start_pos;
  uint *labels;
  Run *pRStack_20;
  int i;
  Run *runs;
  int h;
  int w;
  BRTS<UFPC> *this_local;
  
  iVar3 = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  memset(*(void **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10,0,
         *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x20 -
         *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x18);
  pRStack_20 = (this->data_runs).runs;
  for (labels._4_4_ = 0; labels._4_4_ < iVar3; labels._4_4_ = labels._4_4_ + 1) {
    puVar5 = cv::Mat::ptr<unsigned_int>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat
                        ,labels._4_4_);
    for (; uVar1 = pRStack_20->start_pos, uVar1 != 0xffff; pRStack_20 = pRStack_20 + 1) {
      uVar2 = pRStack_20->end_pos;
      uVar4 = UFPC::GetLabel(pRStack_20->label);
      for (local_3c = (uint)uVar1; (int)local_3c < (int)(uint)uVar2; local_3c = local_3c + 1) {
        puVar5[(int)local_3c] = uVar4;
      }
    }
    pRStack_20 = pRStack_20 + 1;
  }
  return;
}

Assistant:

void SecondScan() {
        int w(img_.cols);
        int h(img_.rows);

        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);

        Run* runs = data_runs.runs;
        for (int i = 0; i < h; i++) {
            unsigned* const labels = img_labels_.ptr<unsigned>(i);
            for (;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    runs++;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::GetLabel(runs->label);
                for (int j = start_pos; j < end_pos; j++) labels[j] = label;
            }
        }
    }